

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLinker.cpp
# Opt level: O1

int __thiscall COLLADASaxFWL::FormulasLinker::link(FormulasLinker *this,char *__from,char *__to)

{
  ulong uVar1;
  Formula *__from_00;
  size_t sVar2;
  INode **ppIVar3;
  int iVar4;
  undefined7 uVar6;
  undefined4 extraout_var;
  size_t sVar7;
  ulong uVar8;
  bool bVar9;
  bool success;
  INode *pIVar5;
  
  uVar1 = this->mFormulas->mCount;
  bVar9 = uVar1 == 0;
  uVar6 = (undefined7)(uVar1 >> 8);
  if (!bVar9) {
    uVar8 = 0;
    do {
      pIVar5 = (INode *)this->mFormulas->mData;
      __from_00 = *(Formula **)(pIVar5 + uVar8);
      sVar2 = (__from_00->mMathmlAsts).mCount;
      if (sVar2 != 0) {
        sVar7 = 0;
        do {
          ppIVar3 = (__from_00->mMathmlAsts).mData;
          iVar4 = link(this,(char *)__from_00,(char *)ppIVar3[sVar7]);
          pIVar5 = (INode *)CONCAT44(extraout_var,iVar4);
          ppIVar3[sVar7] = pIVar5;
          sVar7 = sVar7 + 1;
        } while (sVar2 != sVar7);
      }
      uVar8 = uVar8 + 1;
      bVar9 = uVar1 <= uVar8;
      uVar6 = (undefined7)((ulong)pIVar5 >> 8);
    } while (uVar8 != uVar1);
  }
  return (int)CONCAT71(uVar6,bVar9);
}

Assistant:

bool FormulasLinker::link()
	{
		size_t formulasCount = mFormulas.getCount();
		for ( size_t i = 0; i < formulasCount; ++i)
		{
			COLLADAFW::Formula* formula = mFormulas[i];
			COLLADAFW::MathmlAstArray& asts = formula->getMathmlAsts();
			size_t astsCount = asts.getCount();
			for ( size_t j = 0; j < astsCount; ++j)
			{
				MathML::AST::INode*& astNode =  asts[j];
				bool success = true;
				astNode = link( formula, astNode, success);
				if ( !success )
					return false;
			}
		}
		return true;
	}